

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O2

Time __thiscall helics::apps::Source::runSourceLoop(Source *this,Time currentTime)

{
  _Elt_pointer pSVar1;
  Time TVar2;
  SourceObject *src;
  _Elt_pointer obj;
  _Elt_pointer pSVar3;
  Time TVar4;
  _Map_pointer local_38;
  
  obj = (this->sources).
        super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur;
  pSVar3 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_38 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pSVar1 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (currentTime.internalTimeCode < 0) {
    TVar4.internalTimeCode = 0;
    while (obj != pSVar1) {
      if ((obj->nextTime).internalTimeCode < 0) {
        runSource(this,obj,currentTime);
        (obj->nextTime).internalTimeCode = 0;
      }
      obj = obj + 1;
      if (obj == pSVar3) {
        obj = local_38[1];
        local_38 = local_38 + 1;
        pSVar3 = obj + 2;
      }
    }
  }
  else {
    TVar4.internalTimeCode = 0x7fffffffffffffff;
    while (obj != pSVar1) {
      TVar2 = runSource(this,obj,currentTime);
      if (TVar2.internalTimeCode < TVar4.internalTimeCode) {
        TVar4 = TVar2;
      }
      obj = obj + 1;
      if (obj == pSVar3) {
        obj = local_38[1];
        local_38 = local_38 + 1;
        pSVar3 = obj + 2;
      }
    }
  }
  return (Time)TVar4.internalTimeCode;
}

Assistant:

Time Source::runSourceLoop(Time currentTime)
    {
        if (currentTime < timeZero) {
            for (auto& src : sources) {
                if (src.nextTime < timeZero) {
                    runSource(src, currentTime);
                    src.nextTime = timeZero;
                }
            }
            return timeZero;
        }
        Time minTime = Time::maxVal();
        for (auto& src : sources) {
            auto tm = runSource(src, currentTime);
            if (tm < minTime) {
                minTime = tm;
            }
        }
        return minTime;
    }